

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkrequest.cpp
# Opt level: O1

QByteArray * QNetworkHeadersPrivate::toHttpDate(QByteArray *__return_storage_ptr__,QDateTime *dt)

{
  long in_FS_OFFSET;
  QStringView QVar1;
  QDateTime local_50 [8];
  QLocale local_48 [8];
  QArrayData *local_40 [3];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  QLocale::QLocale(local_48,1,0,0);
  QDateTime::toUTC();
  QVar1.m_data = (storage_type_conflict *)local_50;
  QVar1.m_size = (qsizetype)local_48;
  QLocale::toString((QDateTime *)local_40,QVar1);
  QString::toLatin1_helper_inplace((QString *)__return_storage_ptr__);
  if (local_40[0] != (QArrayData *)0x0) {
    LOCK();
    (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_40[0],2,0x10);
    }
  }
  QDateTime::~QDateTime(local_50);
  QLocale::~QLocale(local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QByteArray QNetworkHeadersPrivate::toHttpDate(const QDateTime &dt)
{
    return QLocale::c().toString(dt.toUTC(), u"ddd, dd MMM yyyy hh:mm:ss 'GMT'").toLatin1();
}